

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

int grow_expansion(int elen,double *e,double b,double *h)

{
  double dVar1;
  double around;
  double bround;
  double avirt;
  double bvirt;
  double enow;
  int eindex;
  double Qnew;
  double Q;
  double *h_local;
  double b_local;
  double *e_local;
  int elen_local;
  
  Qnew = b;
  for (enow._4_4_ = 0; enow._4_4_ < elen; enow._4_4_ = enow._4_4_ + 1) {
    dVar1 = Qnew + e[enow._4_4_];
    h[enow._4_4_] = (Qnew - (dVar1 - (dVar1 - Qnew))) + (e[enow._4_4_] - (dVar1 - Qnew));
    Qnew = dVar1;
  }
  h[enow._4_4_] = Qnew;
  return enow._4_4_ + 1;
}

Assistant:

int grow_expansion(int elen, REAL *e, REAL b, REAL *h)
/* e and h can be the same. */
{
  REAL Q;
  INEXACT REAL Qnew;
  int eindex;
  REAL enow;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;

  Q = b;
  for (eindex = 0; eindex < elen; eindex++) {
    enow = e[eindex];
    Two_Sum(Q, enow, Qnew, h[eindex]);
    Q = Qnew;
  }
  h[eindex] = Q;
  return eindex + 1;
}